

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

uint __thiscall
ON_MeshNgon::GetBoundarySides
          (ON_MeshNgon *this,ON_MeshFaceList *mesh_face_list,
          ON_SimpleArray<unsigned_int> *ngon_boundary_sides)

{
  uint uVar1;
  uint *face_index_list;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint ngon_boundary_index;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  ON_SimpleArray<NgonNeighbors> local_48;
  
  iVar4 = ngon_boundary_sides->m_capacity;
  if (-1 < iVar4) {
    ngon_boundary_sides->m_count = 0;
  }
  uVar1 = this->m_Fcount;
  face_index_list = this->m_fi;
  if (face_index_list != (uint *)0x0 && (ulong)uVar1 != 0) {
    local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00814f70;
    local_48.m_a = (NgonNeighbors *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    ON_SimpleArray<NgonNeighbors>::SetCapacity(&local_48,(ulong)uVar1);
    if ((-1 < (int)uVar1) && ((int)uVar1 <= local_48.m_capacity)) {
      local_48.m_count = uVar1;
    }
    uVar2 = SetFaceNeighborMap(0xfffffffe,mesh_face_list,(uint **)0x0,(ON_MeshVertexFaceMap *)0x0,
                               uVar1,face_index_list,local_48.m_a);
    if (uVar2 != 0) {
      if (-1 < (long)ngon_boundary_sides->m_capacity) {
        ngon_boundary_sides->m_count = 0;
      }
      if ((ulong)(long)ngon_boundary_sides->m_capacity < (ulong)uVar2) {
        ON_SimpleArray<unsigned_int>::SetCapacity(ngon_boundary_sides,(ulong)uVar2);
      }
      ngon_boundary_index = 0;
      while (uVar3 = GetNgonBoundarySegments
                               (mesh_face_list,uVar1,face_index_list,ngon_boundary_index,
                                local_48.m_a,(ON_SimpleArray<unsigned_int> *)0x0,ngon_boundary_sides
                               ), uVar3 != 0) {
        ngon_boundary_index = ngon_boundary_index + uVar3;
        if (uVar2 <= ngon_boundary_index) {
          uVar1 = ngon_boundary_sides->m_count;
          ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&local_48);
          return uVar1;
        }
      }
    }
    ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&local_48);
    iVar4 = ngon_boundary_sides->m_capacity;
  }
  if (-1 < iVar4) {
    ngon_boundary_sides->m_count = 0;
  }
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::GetBoundarySides(
  const class ON_MeshFaceList& mesh_face_list,
  ON_SimpleArray<unsigned int>& ngon_boundary_sides
  ) const
{
  unsigned int ngon_boundary_segment_count = 0;
  unsigned int boundary_edge_count;

  ngon_boundary_sides.SetCount(0);


  for(;;)
  {
    const unsigned int ngon_fi_count(m_Fcount);
    const unsigned int* ngon_fi(m_fi);
    if ( ngon_fi_count <= 0 || 0 == ngon_fi )
      break;

    const unsigned int mesh_vertex_count = 0xFFFFFFFE;
    const unsigned int *const* vertex_face_map = 0;

    ON_SimpleArray<struct NgonNeighbors> ngon_nbr_map;
    ngon_nbr_map.Reserve(ngon_fi_count);
    ngon_nbr_map.SetCount(ngon_fi_count);
    boundary_edge_count = SetFaceNeighborMap(
      mesh_vertex_count,
      mesh_face_list,
      vertex_face_map,
      nullptr,
      ngon_fi_count,
      ngon_fi,
      ngon_nbr_map.Array()
      );

    if ( boundary_edge_count <= 0 )
      break;

    ngon_boundary_sides.SetCount(0);
    ngon_boundary_sides.Reserve(boundary_edge_count);

    for(;;)
    {
      // keep adding boundary components until we
      // find all of them or there is an error
      unsigned int segment_count =  GetNgonBoundarySegments(
        mesh_face_list,
        (unsigned int)ngon_fi_count,
        ngon_fi,
        ngon_boundary_segment_count,
        ngon_nbr_map.Array(),
        0,
        &ngon_boundary_sides
        );
      if ( segment_count <= 0 )
        break; //error

      ngon_boundary_segment_count += segment_count;
      if ( ngon_boundary_segment_count >= boundary_edge_count )
        return ngon_boundary_sides.UnsignedCount(); // found them all
    }

    break; // error if we get here
  }

  // failure
  ngon_boundary_sides.SetCount(0);

  return 0;
}